

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashFunc.cpp
# Opt level: O2

ULONG CaseInsensitiveComputeHash(LPCOLESTR posz)

{
  OLECHAR OVar1;
  ULONG UVar2;
  OLECHAR OVar3;
  
  UVar2 = 0;
  while( true ) {
    OVar1 = *posz;
    if (OVar1 == L'\0') break;
    posz = posz + 1;
    OVar3 = OVar1 | 0x20;
    if (0x19 < (ushort)(OVar1 + L'﾿')) {
      OVar3 = OVar1;
    }
    UVar2 = (uint)(ushort)OVar3 + UVar2 * 0x11;
  }
  return UVar2;
}

Assistant:

ULONG CaseInsensitiveComputeHash(LPCOLESTR posz)
{
    ULONG luHash = 0;
    char16 ch;
    while (0 != (ch = *(char16 *)posz++))
    {
        if (ch <= 'Z' && ch >= 'A')
            ch += 'a' - 'A';
        luHash = 17 * luHash + ch;
    }
    return luHash;
}